

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O1

void anon_unknown.dwarf_15f85::_create_window_with_message_loop
               (WindowHandle user_data,string *title,int x,int y,int w,int h)

{
  mutex *__mutex;
  byte bVar1;
  IWindowListener *pIVar2;
  int TgtWidth;
  undefined4 TgtHeight;
  int iVar3;
  Display *pDVar4;
  Window WVar5;
  GC p_Var6;
  Pixmap PVar7;
  char *pcVar8;
  XImage *pXVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  size_t sVar14;
  double dVar15;
  Atom wmDeleteMessage;
  XGCValues values;
  XEvent nev;
  
  __mutex = &user_data->mt;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
LAB_001062b7:
    std::__throw_system_error(iVar3);
  }
  pDVar4 = (Display *)XOpenDisplay(0);
  user_data->display = pDVar4;
  lVar10 = *(long *)(pDVar4 + 0xe8);
  lVar13 = (long)*(int *)(pDVar4 + 0xe0) * 0x80;
  WVar5 = XCreateSimpleWindow(pDVar4,*(undefined8 *)(lVar10 + 0x10 + lVar13),x,y,w,h,2,
                              *(undefined8 *)(lVar10 + 0x60 + lVar13),
                              *(undefined8 *)(lVar10 + 0x58 + lVar13));
  user_data->win = WVar5;
  pDVar4 = user_data->display;
  user_data->visual = *(Visual **)(*(long *)(pDVar4 + 0xe8) + 0x40 + lVar13);
  iVar3 = *(int *)(pDVar4 + 0xe0);
  p_Var6 = (GC)XCreateGC(pDVar4,WVar5,0,&values);
  XSetForeground(pDVar4,p_Var6,*(undefined8 *)(*(long *)(pDVar4 + 0xe8) + 0x60 + (long)iVar3 * 0x80)
                );
  XSetBackground(pDVar4,p_Var6,*(undefined8 *)(*(long *)(pDVar4 + 0xe8) + 0x58 + (long)iVar3 * 0x80)
                );
  XSetLineAttributes(pDVar4,p_Var6,2,0,1,2);
  XSetFillStyle(pDVar4,p_Var6,0);
  user_data->gc = p_Var6;
  XStoreName(user_data->display,user_data->win,(title->_M_dataplus)._M_p);
  XMapWindow(user_data->display,user_data->win);
  XSync(user_data->display,0);
  XSelectInput(user_data->display,user_data->win,0x28003);
  pDVar4 = user_data->display;
  PVar7 = XCreatePixmap(pDVar4,*(undefined8 *)
                                (*(long *)(pDVar4 + 0xe8) + 0x10 +
                                (long)*(int *)(pDVar4 + 0xe0) * 0x80),w,h,
                        *(undefined4 *)(*(long *)(pDVar4 + 0xe8) + 0x38 + lVar13));
  user_data->pix = PVar7;
  user_data->pix_w = w;
  user_data->pix_h = h;
  sVar14 = (long)w * (long)h * 4;
  pcVar8 = (char *)malloc(sVar14);
  user_data->data = pcVar8;
  memset(pcVar8,0,sVar14);
  pXVar9 = (XImage *)
           XCreateImage(user_data->display,user_data->visual,
                        *(undefined4 *)(*(long *)(user_data->display + 0xe8) + 0x38 + lVar13),2,0,
                        pcVar8,(long)w,(long)h,0x20,0);
  user_data->im = pXVar9;
  XPutImage(user_data->display,user_data->pix,user_data->gc,pXVar9,0,0,0,0,user_data->pix_w,
            user_data->pix_h);
  wmDeleteMessage = XInternAtom(user_data->display,"WM_DELETE_WINDOW",0);
  XSetWMProtocols(user_data->display,user_data->win,&wmDeleteMessage,1);
  LOCK();
  (user_data->quit)._M_base._M_i = false;
  UNLOCK();
  user_data->initialised = true;
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  bVar1 = (user_data->quit)._M_base._M_i;
  do {
    if ((bVar1 & 1) != 0) {
      return;
    }
    lVar10 = std::chrono::_V2::system_clock::now();
    while ((user_data->display != (Display *)0x0 && (iVar3 = XPending(), iVar3 != 0))) {
      XNextEvent(user_data->display,&values);
      TgtHeight = values._60_4_;
      TgtWidth = values.arc_mode;
      if (values.function < 0xc) {
        if (values.function == 2) {
          pIVar2 = user_data->listener;
          if (pIVar2 != (IWindowListener *)0x0) {
            (**(code **)(*(long *)pIVar2 + 8))(pIVar2,values.ts_y_origin);
          }
        }
        else if (values.function == 3) {
          iVar3 = XEventsQueued(user_data->display,1);
          if ((((iVar3 == 0) || (XPeekEvent(user_data->display,&nev), nev.type != 2)) ||
              (nev.xkey.time != CONCAT44(values._60_4_,values.arc_mode))) ||
             (nev.xkey.keycode != values.ts_y_origin)) {
            pIVar2 = user_data->listener;
            if (pIVar2 != (IWindowListener *)0x0) {
              (**(code **)(*(long *)pIVar2 + 0x10))(pIVar2,values.ts_y_origin);
            }
          }
          else {
            XNextEvent(user_data->display,&values);
          }
        }
      }
      else if (values.function == 0x21) {
        iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar3 != 0) goto LAB_001062b7;
        LOCK();
        (user_data->quit)._M_base._M_i = true;
        UNLOCK();
        if (user_data->listener != (IWindowListener *)0x0) {
          (*(code *)**(undefined8 **)user_data->listener)();
        }
        (*(user_data->im->f).destroy_image)(user_data->im);
        XFreePixmap(user_data->display,user_data->pix);
        XCloseDisplay(user_data->display);
        user_data->display = (Display *)0x0;
        user_data->listener = (IWindowListener *)0x0;
LAB_0010607c:
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      else if (values.function == 0x16) {
        if ((values.arc_mode != user_data->pix_w) || (values._60_4_ != user_data->pix_h)) {
          iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
          if (iVar3 != 0) goto LAB_001062b7;
          XFreePixmap(user_data->display,user_data->pix);
          (*(user_data->im->f).destroy_image)(user_data->im);
          sVar14 = (long)(int)TgtHeight * (long)TgtWidth * 4;
          pcVar8 = (char *)malloc(sVar14);
          user_data->data = pcVar8;
          pXVar9 = (XImage *)
                   XCreateImage(user_data->display,user_data->visual,
                                *(undefined4 *)
                                 (*(long *)(user_data->display + 0xe8) + 0x38 + lVar13),2,0,pcVar8,
                                TgtWidth,TgtHeight,0x20,0);
          user_data->im = pXVar9;
          pDVar4 = user_data->display;
          PVar7 = XCreatePixmap(pDVar4,*(undefined8 *)
                                        (*(long *)(pDVar4 + 0xe8) + 0x10 +
                                        (long)*(int *)(pDVar4 + 0xe0) * 0x80),TgtWidth,TgtHeight,
                                *(undefined4 *)(*(long *)(pDVar4 + 0xe8) + 0x38 + lVar13));
          user_data->pix = PVar7;
          user_data->pix_w = TgtWidth;
          user_data->pix_h = TgtHeight;
          if ((user_data->w == 0) || (user_data->h == 0)) {
            memset(user_data->data,0,sVar14);
          }
          else {
            _scale((uint32_t *)user_data->data,TgtWidth,TgtHeight,user_data->bytes,user_data->w,
                   user_data->h);
          }
          XPutImage(user_data->display,user_data->pix,user_data->gc,user_data->im,0,0,0,0,
                    user_data->pix_w,user_data->pix_h);
          XFlush(user_data->display);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
      }
      else if (values.function == 0xc) {
        iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar3 == 0) {
          XCopyArea(user_data->display,user_data->pix,user_data->win,user_data->gc,0,0,
                    user_data->pix_w,user_data->pix_h,0,0);
          goto LAB_0010607c;
        }
        goto LAB_001062b7;
      }
    }
    lVar11 = std::chrono::_V2::system_clock::now();
    dVar15 = (double)(lVar11 - lVar10) / 1000.0;
    if ((dVar15 < 1000.0) && (dVar15 = 1000.0 - dVar15, 0.0 < dVar15)) {
      values._0_8_ = (BADTYPE)(dVar15 / 1000000.0);
      values.plane_mask =
           (unsigned_long)((dVar15 - (double)(long)values._0_8_ * 1000000.0) * 1000.0);
      do {
        iVar3 = nanosleep((timespec *)&values,(timespec *)&values);
        if (iVar3 != -1) break;
        piVar12 = __errno_location();
      } while (*piVar12 == 4);
    }
    bVar1 = (user_data->quit)._M_base._M_i;
  } while( true );
}

Assistant:

void _create_window_with_message_loop(WindowHandle user_data, const std::string& title, int x, int y, int w, int h)
    {
    user_data->mt.lock();
    user_data->display = XOpenDisplay(0);
    int screen_num = DefaultScreen(user_data->display);

    user_data->win = XCreateSimpleWindow(user_data->display, RootWindow(user_data->display, screen_num),
      x, y, w, h, 2, BlackPixel(user_data->display, screen_num),
      WhitePixel(user_data->display, screen_num));

    user_data->visual = DefaultVisual(user_data->display, screen_num);
    user_data->gc = create_gc(user_data->display, user_data->win, 0);

    XStoreName(user_data->display, user_data->win, title.c_str());
    XMapWindow(user_data->display, user_data->win);
    XSync(user_data->display, False);
    XSelectInput(user_data->display, user_data->win, ExposureMask | StructureNotifyMask | KeyPressMask | KeyReleaseMask); // Set the events we want to receive
    
    user_data->pix = XCreatePixmap(user_data->display, DefaultRootWindow(user_data->display), w, h, DefaultDepth(user_data->display, screen_num)); // Pixmap for off-screen rendering
    user_data->pix_w = w;
    user_data->pix_h = h;
    
    user_data->data = (char*)malloc(sizeof(uint8_t)*w*h * 4); // Pointer to memory for off-screen rendering
    memset(user_data->data, 0, sizeof(uint8_t)*w*h * 4); // Initialize to black
    user_data->im = XCreateImage(user_data->display, user_data->visual, DefaultDepth(user_data->display, screen_num), ZPixmap, 0, user_data->data, w, h, 32, 0); // Container for user_data->data
    XPutImage(user_data->display, user_data->pix, user_data->gc, user_data->im, 0, 0, 0, 0, user_data->pix_w, user_data->pix_h); // Draw the XImage on the Pixmap
    
    Atom wmDeleteMessage = XInternAtom(user_data->display, "WM_DELETE_WINDOW", False); // When the close button is pressed, the window manager should send this to us as a event (ClientMessage).
    XSetWMProtocols(user_data->display, user_data->win, &wmDeleteMessage, 1);   
    
    user_data->quit = false;
    user_data->initialised = true;
    user_data->cv.notify_all();
    user_data->mt.unlock();

    while (!user_data->quit)
      {
      auto tic = std::chrono::high_resolution_clock::now();
      while (user_data->display && XPending(user_data->display))
        {
        XEvent ev;
        XNextEvent(user_data->display, &ev);
        //printf("event type: %d\n", ev.type); 
        switch (ev.type)
          {
          case Expose:
          {
          user_data->mt.lock();
          XCopyArea(user_data->display, user_data->pix, user_data->win, user_data->gc, 0, 0, user_data->pix_w, user_data->pix_h, 0, 0); // Copy the pixmap to the window for on-screen rendering.
          user_data->mt.unlock();
          break;
          }
          case KeyPress:
          {
          if (user_data->listener)
            user_data->listener->OnKeyDown(ev.xkey.keycode);
          break;
          }
          case KeyRelease:
          {
          unsigned short is_retriggered = 0;
          
          if (XEventsQueued(user_data->display, QueuedAfterReading))
            {
            XEvent nev;
            XPeekEvent(user_data->display, &nev);
            
            if (nev.type == KeyPress && nev.xkey.time == ev.xkey.time && nev.xkey.keycode == ev.xkey.keycode)
              {
              XNextEvent(user_data->display, &ev);
              is_retriggered = 1;
              }
            }
          
          
          if (!is_retriggered && user_data->listener)
            user_data->listener->OnKeyUp(ev.xkey.keycode);
          break;
          }
          case ClientMessage:
          {
          user_data->mt.lock();
          user_data->quit = true;
          if (user_data->listener)
            user_data->listener->OnClose();
          XDestroyImage(user_data->im);
          XFreePixmap(user_data->display, user_data->pix);
          XCloseDisplay(user_data->display);
          user_data->display = nullptr;
          user_data->listener = nullptr;
          user_data->mt.unlock();
          break;
          }
          case ConfigureNotify:
          {
          XConfigureEvent xce = ev.xconfigure;
          if (xce.width != user_data->pix_w || xce.height != user_data->pix_h)
            {
            user_data->mt.lock();
            XFreePixmap(user_data->display, user_data->pix); // Free pixmap  
            XDestroyImage(user_data->im); // Free XImage (and user_data->data)
            user_data->data = (char*)malloc(sizeof(uint8_t)*xce.width*xce.height * 4); // Allocate new memory
            user_data->im = XCreateImage(user_data->display, user_data->visual, DefaultDepth(user_data->display, screen_num), ZPixmap, 0, user_data->data, xce.width, xce.height, 32, 0);   // Create container for user_data->data as XImage.
            user_data->pix = XCreatePixmap(user_data->display, DefaultRootWindow(user_data->display), xce.width, xce.height, DefaultDepth(user_data->display, screen_num)); // Create Pixmap
            user_data->pix_w = xce.width;
            user_data->pix_h = xce.height;
            if (user_data->w && user_data->h)
              _scale((uint32_t*)user_data->data, user_data->pix_w, user_data->pix_h, (uint32_t*)user_data->bytes, user_data->w, user_data->h); // Mipmap user bitmap (user_data->bytes) to screen bitmap
            else
              memset(user_data->data, 0, sizeof(uint8_t)*xce.width*xce.height * 4);
            XPutImage(user_data->display, user_data->pix, user_data->gc, user_data->im, 0, 0, 0, 0, user_data->pix_w, user_data->pix_h); // Copy XImage to Pixmap
            XFlush(user_data->display);
            user_data->mt.unlock();            
            }
          break;
          }
          default: break;
          }
        }
      auto toc = std::chrono::high_resolution_clock::now();
      const std::chrono::duration<double, std::micro> time_elapsed = (toc-tic);
      if (time_elapsed < std::chrono::duration<double, std::micro>(1000))
        std::this_thread::sleep_for(std::chrono::duration<double, std::micro>(1000)-time_elapsed);
      }
    }